

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

void nghttp2_http_record_request_method(nghttp2_stream *stream,nghttp2_frame *frame)

{
  int iVar1;
  long *plVar2;
  nghttp2_nv *nv;
  size_t i;
  size_t nvlen;
  nghttp2_nv *nva;
  nghttp2_frame *frame_local;
  nghttp2_stream *stream_local;
  
  if ((frame->hd).type == '\x01') {
    nvlen = (size_t)(frame->headers).nva;
    i = (frame->headers).nvlen;
  }
  else {
    if ((frame->hd).type != '\x05') {
      return;
    }
    nvlen = (size_t)(frame->settings).iv;
    i = (frame->push_promise).nvlen;
  }
  nv = (nghttp2_nv *)0x0;
  while( true ) {
    if (i <= nv) {
      return;
    }
    plVar2 = (long *)(nvlen + (long)nv * 0x28);
    if (((plVar2[2] == 7) && (*(char *)(*plVar2 + 6) == 'd')) &&
       (iVar1 = memcmp(":metho",(void *)*plVar2,plVar2[2] - 1), iVar1 == 0)) break;
    nv = (nghttp2_nv *)((long)&nv->name + 1);
  }
  if ((plVar2[3] == 7) && (iVar1 = memcmp("CONNECT",(void *)plVar2[1],plVar2[3]), iVar1 == 0)) {
    stream->http_flags = stream->http_flags | 0x80;
    return;
  }
  if (plVar2[3] != 4) {
    return;
  }
  iVar1 = memcmp("HEAD",(void *)plVar2[1],plVar2[3]);
  if (iVar1 != 0) {
    return;
  }
  stream->http_flags = stream->http_flags | 0x100;
  return;
}

Assistant:

void nghttp2_http_record_request_method(nghttp2_stream *stream,
                                        nghttp2_frame *frame) {
  const nghttp2_nv *nva;
  size_t nvlen;
  size_t i;

  switch (frame->hd.type) {
  case NGHTTP2_HEADERS:
    nva = frame->headers.nva;
    nvlen = frame->headers.nvlen;
    break;
  case NGHTTP2_PUSH_PROMISE:
    nva = frame->push_promise.nva;
    nvlen = frame->push_promise.nvlen;
    break;
  default:
    return;
  }

  /* TODO we should do this strictly. */
  for (i = 0; i < nvlen; ++i) {
    const nghttp2_nv *nv = &nva[i];
    if (!(nv->namelen == 7 && nv->name[6] == 'd' &&
          memcmp(":metho", nv->name, nv->namelen - 1) == 0)) {
      continue;
    }
    if (lstreq("CONNECT", nv->value, nv->valuelen)) {
      stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_CONNECT;
      return;
    }
    if (lstreq("HEAD", nv->value, nv->valuelen)) {
      stream->http_flags |= NGHTTP2_HTTP_FLAG_METH_HEAD;
      return;
    }
    return;
  }
}